

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_485276::cmCaseInsensitiveDirectoryListGenerator::GetNextCandidate
          (string *__return_storage_ptr__,cmCaseInsensitiveDirectoryListGenerator *this,
          string *parent)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  Status SVar4;
  unsigned_long uVar5;
  char *fname;
  char local_39;
  char *local_38;
  
  if (this->Loaded == false) {
    this->CurrentIdx = 0;
    this->Loaded = true;
    SVar4 = cmsys::Directory::Load(&this->DirectoryLister,parent,(string *)0x0);
    if (SVar4.Kind_ != Success) goto LAB_0020b034;
  }
  while (uVar1 = this->CurrentIdx,
        uVar5 = cmsys::Directory::GetNumberOfFiles(&this->DirectoryLister), uVar1 < uVar5) {
    uVar5 = this->CurrentIdx;
    this->CurrentIdx = uVar5 + 1;
    local_38 = cmsys::Directory::GetFile(&this->DirectoryLister,uVar5);
    bVar2 = isDirentryToIgnore(local_38);
    if ((!bVar2) && (iVar3 = cmsysString_strcasecmp(local_38,(this->DirName)._M_str), iVar3 == 0)) {
      local_39 = '/';
      cmStrCat<std::__cxx11::string_const&,char,char_const*const&>
                (__return_storage_ptr__,parent,&local_39,&local_38);
      bVar2 = cmsys::SystemTools::FileIsDirectory(__return_storage_ptr__);
      if (bVar2) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
  }
LAB_0020b034:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string GetNextCandidate(const std::string& parent)
  {
    if (!this->Loaded) {
      this->CurrentIdx = 0ul;
      this->Loaded = true;
      if (!this->DirectoryLister.Load(parent)) {
        return {};
      }
    }

    while (this->CurrentIdx < this->DirectoryLister.GetNumberOfFiles()) {
      const char* const fname =
        this->DirectoryLister.GetFile(this->CurrentIdx++);
      if (isDirentryToIgnore(fname)) {
        continue;
      }
      if (cmsysString_strcasecmp(fname, this->DirName.data()) == 0) {
        auto candidate = cmStrCat(parent, '/', fname);
        if (cmSystemTools::FileIsDirectory(candidate)) {
          return candidate;
        }
      }
    }
    return {};
  }